

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PMP_Multilinear_test.cpp
# Opt level: O3

int PMPML_TestSpeedAlt_64_out_32(void *key,int len,int iter)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  int iVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  int iVar17;
  bool bVar18;
  uint64_t ctr;
  undefined8 local_50;
  uint local_48;
  
  if (iter < 1) {
    iVar17 = 0;
  }
  else {
    uVar1 = len & 3;
    iVar17 = 0;
    do {
      if (0x1f < (uint)len) {
        if ((uint)len < 0x200) {
          uVar2 = PMP_Multilinear_Hasher_64_out_32::_hash_noRecursionNoInline_forLessThanChunk
                            (&pmpml_hasher_64_out_32,(uchar *)key,len);
        }
        else if ((uint)len < 0x1000) {
          uVar2 = PMP_Multilinear_Hasher_64_out_32::_hash_noRecursionNoInline_forLessThan8Chunks
                            (&pmpml_hasher_64_out_32,(uchar *)key,len);
        }
        else {
          uVar2 = PMP_Multilinear_Hasher_64_out_32::_hash_noRecursionNoInline_type2
                            (&pmpml_hasher_64_out_32,(uchar *)key,len);
        }
        goto LAB_001808ff;
      }
      local_50 = (pmpml_hasher_64_out_32.curr_rd)->const_term;
      local_48 = 0;
      switch((ulong)((uint)len >> 2)) {
      case 1:
        uVar3 = (ulong)*key * (ulong)(pmpml_hasher_64_out_32.curr_rd)->random_coeff[0];
        bVar18 = CARRY8(local_50,uVar3);
        local_50 = local_50 + uVar3;
        uVar2 = (uint)bVar18;
        local_48 = (uint)bVar18;
        uVar3 = 1;
        switch(uVar1) {
        case 0:
          goto switchD_00180705_caseD_0;
        case 2:
          goto switchD_00180705_caseD_2;
        case 3:
          goto switchD_00180705_caseD_3;
        }
        goto switchD_00180705_caseD_1;
      case 2:
        uVar3 = (ulong)*key * (ulong)(pmpml_hasher_64_out_32.curr_rd)->random_coeff[0];
        bVar18 = CARRY8(local_50,uVar3);
        uVar3 = local_50 + uVar3;
        uVar4 = (ulong)*(uint *)((long)key + 4) *
                (ulong)(pmpml_hasher_64_out_32.curr_rd)->random_coeff[1];
        local_50 = uVar3 + uVar4;
        local_48 = (uint)bVar18 + (uint)CARRY8(uVar3,uVar4);
        uVar3 = 1;
        uVar2 = local_48;
        switch(uVar1) {
        case 1:
          goto switchD_00180705_caseD_1;
        case 2:
          goto switchD_00180705_caseD_2;
        case 3:
          goto switchD_00180705_caseD_3;
        }
        break;
      case 3:
        uVar3 = (ulong)*key * (ulong)(pmpml_hasher_64_out_32.curr_rd)->random_coeff[0];
        bVar18 = CARRY8(local_50,uVar3);
        uVar3 = local_50 + uVar3;
        uVar4 = (ulong)*(uint *)((long)key + 4) *
                (ulong)(pmpml_hasher_64_out_32.curr_rd)->random_coeff[1];
        uVar6 = uVar3 + uVar4;
        uVar5 = (ulong)*(uint *)((long)key + 8) *
                (ulong)(pmpml_hasher_64_out_32.curr_rd)->random_coeff[2];
        local_50 = uVar6 + uVar5;
        local_48 = (uint)bVar18 + (uint)CARRY8(uVar3,uVar4) + (uint)CARRY8(uVar6,uVar5);
        uVar3 = 1;
        uVar2 = local_48;
        switch(uVar1) {
        case 1:
          goto switchD_00180705_caseD_1;
        case 2:
          goto switchD_00180705_caseD_2;
        case 3:
          goto switchD_00180705_caseD_3;
        }
        break;
      case 4:
        uVar3 = (ulong)*key * (ulong)(pmpml_hasher_64_out_32.curr_rd)->random_coeff[0];
        bVar18 = CARRY8(local_50,uVar3);
        uVar3 = local_50 + uVar3;
        uVar4 = (ulong)*(uint *)((long)key + 4) *
                (ulong)(pmpml_hasher_64_out_32.curr_rd)->random_coeff[1];
        uVar7 = uVar3 + uVar4;
        uVar5 = (ulong)*(uint *)((long)key + 8) *
                (ulong)(pmpml_hasher_64_out_32.curr_rd)->random_coeff[2];
        uVar8 = uVar7 + uVar5;
        uVar6 = (ulong)*(uint *)((long)key + 0xc) *
                (ulong)(pmpml_hasher_64_out_32.curr_rd)->random_coeff[3];
        local_50 = uVar8 + uVar6;
        local_48 = (uint)bVar18 + (uint)CARRY8(uVar3,uVar4) + (uint)CARRY8(uVar7,uVar5) +
                   (uint)CARRY8(uVar8,uVar6);
        uVar3 = 1;
        uVar2 = local_48;
        switch(uVar1) {
        case 1:
          goto switchD_00180705_caseD_1;
        case 2:
          goto switchD_00180705_caseD_2;
        case 3:
          goto switchD_00180705_caseD_3;
        }
        break;
      case 5:
        uVar3 = (ulong)*key * (ulong)(pmpml_hasher_64_out_32.curr_rd)->random_coeff[0];
        bVar18 = CARRY8(local_50,uVar3);
        uVar3 = local_50 + uVar3;
        uVar4 = (ulong)*(uint *)((long)key + 4) *
                (ulong)(pmpml_hasher_64_out_32.curr_rd)->random_coeff[1];
        uVar8 = uVar3 + uVar4;
        uVar5 = (ulong)*(uint *)((long)key + 8) *
                (ulong)(pmpml_hasher_64_out_32.curr_rd)->random_coeff[2];
        uVar9 = uVar8 + uVar5;
        uVar6 = (ulong)*(uint *)((long)key + 0xc) *
                (ulong)(pmpml_hasher_64_out_32.curr_rd)->random_coeff[3];
        uVar12 = uVar9 + uVar6;
        uVar7 = (ulong)*(uint *)((long)key + 0x10) *
                (ulong)(pmpml_hasher_64_out_32.curr_rd)->random_coeff[4];
        local_50 = uVar12 + uVar7;
        local_48 = (uint)bVar18 + (uint)CARRY8(uVar3,uVar4) + (uint)CARRY8(uVar8,uVar5) +
                   (uint)CARRY8(uVar9,uVar6) + (uint)CARRY8(uVar12,uVar7);
        uVar3 = 1;
        uVar2 = local_48;
        switch(uVar1) {
        case 1:
          goto switchD_00180705_caseD_1;
        case 2:
          goto switchD_00180705_caseD_2;
        case 3:
          goto switchD_00180705_caseD_3;
        }
        break;
      case 6:
        uVar3 = (ulong)*key * (ulong)(pmpml_hasher_64_out_32.curr_rd)->random_coeff[0];
        bVar18 = CARRY8(local_50,uVar3);
        uVar3 = local_50 + uVar3;
        uVar4 = (ulong)*(uint *)((long)key + 4) *
                (ulong)(pmpml_hasher_64_out_32.curr_rd)->random_coeff[1];
        uVar9 = uVar3 + uVar4;
        uVar5 = (ulong)*(uint *)((long)key + 8) *
                (ulong)(pmpml_hasher_64_out_32.curr_rd)->random_coeff[2];
        uVar12 = uVar9 + uVar5;
        uVar6 = (ulong)*(uint *)((long)key + 0xc) *
                (ulong)(pmpml_hasher_64_out_32.curr_rd)->random_coeff[3];
        uVar13 = uVar12 + uVar6;
        uVar7 = (ulong)*(uint *)((long)key + 0x10) *
                (ulong)(pmpml_hasher_64_out_32.curr_rd)->random_coeff[4];
        uVar14 = uVar13 + uVar7;
        uVar8 = (ulong)*(uint *)((long)key + 0x14) *
                (ulong)(pmpml_hasher_64_out_32.curr_rd)->random_coeff[5];
        local_50 = uVar14 + uVar8;
        local_48 = (uint)bVar18 + (uint)CARRY8(uVar3,uVar4) + (uint)CARRY8(uVar9,uVar5) +
                   (uint)CARRY8(uVar12,uVar6) + (uint)CARRY8(uVar13,uVar7) +
                   (uint)CARRY8(uVar14,uVar8);
        uVar3 = 1;
        uVar2 = local_48;
        switch(uVar1) {
        case 1:
          goto switchD_00180705_caseD_1;
        case 2:
          goto switchD_00180705_caseD_2;
        case 3:
          goto switchD_00180705_caseD_3;
        }
        break;
      default:
        uVar3 = (ulong)*key * (ulong)(pmpml_hasher_64_out_32.curr_rd)->random_coeff[0];
        bVar18 = CARRY8(local_50,uVar3);
        uVar3 = local_50 + uVar3;
        uVar4 = (ulong)*(uint *)((long)key + 4) *
                (ulong)(pmpml_hasher_64_out_32.curr_rd)->random_coeff[1];
        uVar12 = uVar3 + uVar4;
        uVar5 = (ulong)*(uint *)((long)key + 8) *
                (ulong)(pmpml_hasher_64_out_32.curr_rd)->random_coeff[2];
        uVar13 = uVar12 + uVar5;
        uVar6 = (ulong)*(uint *)((long)key + 0xc) *
                (ulong)(pmpml_hasher_64_out_32.curr_rd)->random_coeff[3];
        uVar14 = uVar13 + uVar6;
        uVar7 = (ulong)*(uint *)((long)key + 0x10) *
                (ulong)(pmpml_hasher_64_out_32.curr_rd)->random_coeff[4];
        uVar15 = uVar14 + uVar7;
        uVar8 = (ulong)*(uint *)((long)key + 0x14) *
                (ulong)(pmpml_hasher_64_out_32.curr_rd)->random_coeff[5];
        uVar16 = uVar15 + uVar8;
        uVar9 = (ulong)*(uint *)((long)key + 0x18) *
                (ulong)(pmpml_hasher_64_out_32.curr_rd)->random_coeff[6];
        local_50 = uVar16 + uVar9;
        local_48 = (uint)bVar18 + (uint)CARRY8(uVar3,uVar4) + (uint)CARRY8(uVar12,uVar5) +
                   (uint)CARRY8(uVar13,uVar6) + (uint)CARRY8(uVar14,uVar7) +
                   (uint)CARRY8(uVar15,uVar8) + (uint)CARRY8(uVar16,uVar9);
      case 0:
        uVar3 = 1;
        uVar2 = local_48;
        switch(uVar1) {
        case 1:
switchD_00180705_caseD_1:
          local_48 = uVar2;
          uVar3 = (ulong)(*(byte *)((long)key + (ulong)(len - 1)) | 0x100);
          break;
        case 2:
switchD_00180705_caseD_2:
          local_48 = uVar2;
          uVar3 = (ulong)(*(ushort *)((long)key + ((ulong)(uint)len - 2)) | 0x10000);
          break;
        case 3:
switchD_00180705_caseD_3:
          local_48 = uVar2;
          uVar3 = (ulong)((uint)*(byte *)((long)key + (ulong)(len - 1)) * 0x10000 + 0x1000000 +
                         (uint)*(ushort *)((long)key + ((ulong)(uint)len - 3)));
        }
      }
switchD_00180705_caseD_0:
      uVar3 = uVar3 * (pmpml_hasher_64_out_32.curr_rd)->random_coeff[(uint)len >> 2];
      uVar4 = local_50 + uVar3;
      local_48 = local_48 + CARRY8(local_50,uVar3);
      uVar3 = (uVar4 >> 0x20) * 0xf;
      uVar2 = local_48 * 0xe1 + 0xf + (int)(uVar3 >> 0x20) * 0xf;
      local_50._0_4_ = (uint)uVar4;
      local_50 = CONCAT44(CARRY4((uint)local_50,uVar2) + 1,(uint)local_50 + uVar2);
      local_50 = local_50 - (uVar3 & 0xffffffff);
      uVar11 = (uint)local_50;
      iVar10 = (int)(local_50 >> 0x20);
      if (uVar11 < 0x1e) {
        if (local_50 >> 0x20 == 0) goto LAB_001808f8;
        uVar2 = uVar11 + 0xf + iVar10 * -0xf;
        if (0xe < uVar2) goto LAB_001808e9;
      }
      else {
LAB_001808e9:
        uVar11 = iVar10 * -0xf + uVar11;
        uVar11 = uVar11 >> 0xd ^ uVar11;
LAB_001808f8:
        uVar2 = uVar11 * -0x54c41ab1 >> 0x10 ^ uVar11 * -0x54c41ab1;
      }
LAB_001808ff:
      iVar17 = iVar17 + uVar2;
      iter = iter + -1;
    } while (iter != 0);
  }
  return iVar17;
}

Assistant:

int PMPML_TestSpeedAlt_64_out_32( const void * key, int len, int iter )
{
	int dummy = 0;
	for ( int i=0; i<iter; i++ )
	{
		dummy += pmpml_hasher_64_out_32.hash( (unsigned char*)key, len );
	}
	return dummy;
}